

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPTf.cpp
# Opt level: O2

void __thiscall OpenMD::NPTf::evolveEtaA(NPTf *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  Mat3x3d *pMVar7;
  Mat3x3d *pMVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  
  dVar1 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2;
  dVar2 = (this->super_NPT).NkBT;
  dVar3 = (this->super_NPT).instaVol;
  pMVar8 = &(this->super_NPT).press;
  dVar4 = (this->super_NPT).tb2;
  dVar5 = (this->super_NPT).targetPressure;
  pMVar7 = pMVar8;
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      if (lVar6 == lVar9) {
        dVar11 = *(double *)
                  ((long)(pMVar8->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                         data_ + lVar6 * 0x20) - dVar5 / 163882576.0;
        lVar10 = lVar6;
      }
      else {
        dVar11 = (pMVar7->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0]
                 [lVar9];
        lVar10 = lVar9;
      }
      (this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[lVar6]
      [lVar10] = (dVar11 * dVar1 * dVar3) / (dVar2 * dVar4) +
                 (this->eta).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
                 [lVar6][lVar10];
    }
    pMVar7 = (Mat3x3d *)
             ((pMVar7->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  }
  pMVar8 = &this->oldEta;
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      (pMVar8->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_[0][lVar9] =
           pMVar8[-1].super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][lVar9]
      ;
    }
    pMVar8 = (Mat3x3d *)
             ((pMVar8->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1);
  }
  return;
}

Assistant:

void NPTf::evolveEtaA() {
    int i, j;

    for (i = 0; i < 3; i++) {
      for (j = 0; j < 3; j++) {
        if (i == j) {
          eta(i, j) +=
              dt2 * instaVol *
              (press(i, j) - targetPressure / Constants::pressureConvert) /
              (NkBT * tb2);
        } else {
          eta(i, j) += dt2 * instaVol * press(i, j) / (NkBT * tb2);
        }
      }
    }

    for (i = 0; i < 3; i++) {
      for (j = 0; j < 3; j++) {
        oldEta(i, j) = eta(i, j);
      }
    }
  }